

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SquareMatrix.hpp
# Opt level: O0

SquareMatrix<double> * __thiscall
qclab::dense::SquareMatrix<double>::operator*=(SquareMatrix<double> *this,SquareMatrix<double> *rhs)

{
  double dVar1;
  double dVar2;
  int64_t iVar3;
  double *pdVar4;
  pointer pdVar5;
  long lVar6;
  long local_38;
  int64_t k;
  int64_t i;
  int64_t j;
  unique_ptr<double[],_std::default_delete<double[]>_> new_data;
  SquareMatrix<double> *rhs_local;
  SquareMatrix<double> *this_local;
  
  lVar6 = this->size_;
  new_data._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
  super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
  super__Head_base<0UL,_double_*,_false>._M_head_impl =
       (__uniq_ptr_data<double,_std::default_delete<double[]>,_true,_true>)
       (__uniq_ptr_data<double,_std::default_delete<double[]>,_true,_true>)rhs;
  iVar3 = size(rhs);
  if (lVar6 == iVar3) {
    init_unique_array<double>((dense *)&j,this->size_ * this->size_);
    for (i = 0; i < this->size_; i = i + 1) {
      for (k = 0; k < this->size_; k = k + 1) {
        for (local_38 = 0; local_38 < this->size_; local_38 = local_38 + 1) {
          pdVar4 = operator()(this,k,local_38);
          dVar1 = *pdVar4;
          pdVar4 = operator()((SquareMatrix<double> *)
                              new_data._M_t.
                              super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
                              super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
                              super__Head_base<0UL,_double_*,_false>._M_head_impl,local_38,i);
          dVar2 = *pdVar4;
          pdVar5 = std::unique_ptr<double[],_std::default_delete<double[]>_>::get
                             ((unique_ptr<double[],_std::default_delete<double[]>_> *)&j);
          lVar6 = k + i * this->size_;
          pdVar5[lVar6] = dVar1 * dVar2 + pdVar5[lVar6];
        }
      }
    }
    std::unique_ptr<double[],_std::default_delete<double[]>_>::operator=
              (&this->data_,(unique_ptr<double[],_std::default_delete<double[]>_> *)&j);
    std::unique_ptr<double[],_std::default_delete<double[]>_>::~unique_ptr
              ((unique_ptr<double[],_std::default_delete<double[]>_> *)&j);
    return this;
  }
  __assert_fail("size_ == rhs.size()",
                "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/include/qclab/dense/SquareMatrix.hpp"
                ,0xb0,
                "SquareMatrix<T> &qclab::dense::SquareMatrix<double>::operator*=(const SquareMatrix<T> &) [T = double]"
               );
}

Assistant:

inline SquareMatrix< T >& operator*=( const SquareMatrix< T >& rhs ) {
          assert( size_ == rhs.size() ) ;
          auto new_data = init_unique_array< T >( size_ * size_ ) ;
          #pragma omp parallel for
          for ( int64_t j = 0; j < size_; j++ ) {
            for ( int64_t i = 0; i < size_; i++ ) {
              for ( int64_t k = 0; k < size_; k++ ) {
                new_data.get()[ i + j*size_ ] += (*this)(i,k) * rhs(k,j) ;
              }
            }
          }
          data_ = std::move( new_data ) ;
          return *this ;
        }